

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O1

void TPZShapeH1<pzshape::TPZShapePiram>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int nod;
  long lVar5;
  ulong uVar6;
  TPZTransform<double> *this;
  int d_1;
  long lVar7;
  int d;
  int side;
  long lVar8;
  int xj;
  long lVar9;
  TPZFNMatrix<1,_double> auxmat;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> phin;
  TPZFNMatrix<57,_double> phiblend;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<57,_double> dphiblend;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphiaux2;
  ulong local_1550;
  long local_1520;
  TPZFMatrix<double> local_14a8;
  double adStack_1418 [2];
  TPZManVector<double,_3> local_1408;
  TPZFMatrix<double> local_13d0;
  double adStack_1340 [101];
  TPZFMatrix<double> local_1018;
  double local_f88 [58];
  TPZFMatrix<double> local_db8;
  double local_d28 [101];
  TPZFMatrix<double> local_a00;
  double local_970 [58];
  TPZFMatrix<double> local_7a0;
  double local_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  pzshape::TPZShapePiram::ShapeCorner
            (pt,&(data->fPhi).super_TPZFMatrix<double>,&(data->fDPhi).super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 5) {
    local_1018.fElem = local_f88;
    local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x13;
    local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e48e8;
    local_1018.fSize = 0x39;
    local_1018.fGiven = local_1018.fElem;
    TPZVec<int>::TPZVec(&local_1018.fPivot.super_TPZVec<int>,0);
    local_1018.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_1018.fPivot.super_TPZVec<int>.fStore = local_1018.fPivot.fExtAlloc;
    local_1018.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1018.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1018.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_1018.fWork.fStore = (double *)0x0;
    local_1018.fWork.fNElements = 0;
    local_1018.fWork.fNAlloc = 0;
    local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e45f8;
    local_a00.fElem = local_970;
    local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x13;
    local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018e48e8;
    local_a00.fSize = 0x39;
    local_a00.fGiven = local_a00.fElem;
    TPZVec<int>::TPZVec(&local_a00.fPivot.super_TPZVec<int>,0);
    local_a00.fPivot.super_TPZVec<int>.fStore = local_a00.fPivot.fExtAlloc;
    local_a00.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_a00.fPivot.super_TPZVec<int>.fNElements = 0;
    local_a00.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_a00.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_a00.fWork.fStore = (double *)0x0;
    local_a00.fWork.fNElements = 0;
    local_a00.fWork.fNAlloc = 0;
    local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018e45f8;
    lVar7 = 0;
    lVar5 = 0;
    do {
      if (((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar5) ||
         ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1
         )) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
         (local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1018.fElem[lVar5] = (data->fPhi).super_TPZFMatrix<double>.fElem[lVar5];
      lVar8 = 0;
      do {
        if (((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar8) ||
           ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
            <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_a00.fElem +
         lVar8 * 8 + local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7) =
             *(undefined8 *)
              ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
              lVar8 * 8 +
              (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow * lVar7);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar5 != 5);
    pzshape::TPZShapePiram::ShapeGenerating(pt,&local_1018,&local_a00);
    local_1550 = 5;
    lVar5 = 5;
    local_1520 = 0x28;
    do {
      side = (int)lVar5;
      uVar1 = pzshape::TPZShapePiram::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -5]);
      if (uVar1 != 0) {
        if ((local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (long)(int)local_1550;
        if ((((int)local_1550 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar7)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (data->fPhi).super_TPZFMatrix<double>.fElem[lVar7] = local_1018.fElem[lVar5];
        lVar8 = 0;
        do {
          if ((local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
             (local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow <= lVar8) || ((int)local_1550 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->fDPhi).super_TPZFMatrix<double>.fElem
          [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
           lVar7 + lVar8] =
               *(double *)
                ((long)local_a00.fElem +
                lVar8 * 8 + local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1520)
          ;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        uVar2 = (int)local_1550 + 1;
        local_1550 = (ulong)uVar2;
        if (uVar1 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar5 + -5;
          iVar3 = pztopology::TPZPyramid::SideDimension(side);
          lVar7 = (long)(int)uVar1;
          local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_13d0.fSize = 100;
          local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar7;
          local_13d0.fElem = adStack_1340;
          local_13d0.fGiven = adStack_1340;
          TPZVec<int>::TPZVec(&local_13d0.fPivot.super_TPZVec<int>,0);
          local_13d0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_13d0.fPivot.super_TPZVec<int>.fStore = local_13d0.fPivot.fExtAlloc;
          local_13d0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_13d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_13d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_13d0.fWork.fStore = (double *)0x0;
          local_13d0.fWork.fNElements = 0;
          local_13d0.fWork.fNAlloc = 0;
          if (100 < (int)uVar1) {
            local_13d0.fElem = (double *)operator_new__(lVar7 * 8);
          }
          local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          lVar8 = (long)iVar3;
          local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_db8.fSize = 100;
          local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
          local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_db8.fElem = local_d28;
          local_db8.fGiven = local_d28;
          TPZVec<int>::TPZVec(&local_db8.fPivot.super_TPZVec<int>,0);
          local_db8.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_db8.fPivot.super_TPZVec<int>.fStore = local_db8.fPivot.fExtAlloc;
          local_db8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_db8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_db8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_db8.fWork.fStore = (double *)0x0;
          local_db8.fWork.fNElements = 0;
          local_db8.fWork.fNAlloc = 0;
          if (iVar3 == 0) {
            local_db8.fElem = (double *)0x0;
          }
          else {
            uVar4 = lVar8 * lVar7;
            if (100 < (long)uVar4) {
              uVar6 = uVar4 * 8;
              if (0x1fffffffffffffff < uVar4) {
                uVar6 = 0xffffffffffffffff;
              }
              local_db8.fElem = (double *)operator_new__(uVar6);
            }
          }
          local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_7a0.fSize = 100;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_7a0.fElem = local_710;
          local_7a0.fGiven = local_710;
          TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
          local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
          local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_7a0.fWork.fStore = (double *)0x0;
          local_7a0.fWork.fNElements = 0;
          local_7a0.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar1) {
            uVar4 = lVar7 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 3)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_7a0.fElem = (double *)operator_new__(uVar4);
          }
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_3e8.fSize = 100;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_3e8.fElem = local_358;
          local_3e8.fGiven = local_358;
          TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
          local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
          local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_3e8.fWork.fStore = (double *)0x0;
          local_3e8.fWork.fNElements = 0;
          local_3e8.fWork.fNAlloc = 0;
          if (0x21 < (int)uVar1) {
            uVar4 = lVar7 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 3)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_3e8.fElem = (double *)operator_new__(uVar4);
          }
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          TPZManVector<double,_3>::TPZManVector(&local_1408,lVar8);
          TPZTransform<double>::Apply(this,pt,&local_1408.super_TPZVec<double>);
          pzshape::TPZShapePiram::ShapeInternal
                    (side,&local_1408.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -5],&local_13d0,
                     &local_db8);
          if (iVar3 < 3) {
            local_14a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
            local_14a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_14a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_14a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_14a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFMatrix_018e21e8;
            local_14a8.fSize = 1;
            local_14a8.fElem = adStack_1418;
            local_14a8.fGiven = adStack_1418;
            TPZVec<int>::TPZVec(&local_14a8.fPivot.super_TPZVec<int>,0);
            local_14a8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            local_14a8.fPivot.super_TPZVec<int>.fStore = local_14a8.fPivot.fExtAlloc;
            local_14a8.fPivot.super_TPZVec<int>.fNElements = 0;
            local_14a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_14a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            local_14a8.fWork.fStore = (double *)0x0;
            local_14a8.fWork.fNElements = 0;
            local_14a8.fWork.fNAlloc = 0;
            local_14a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFNMatrix_018e1ef8;
            TPZFMatrix<double>::operator=(&local_14a8,0.0);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&local_db8,&local_14a8,&local_7a0,1);
            if (1 < (int)uVar1) {
              local_1550 = (ulong)(int)uVar2;
              lVar7 = local_1550 * 8;
              uVar4 = 1;
              lVar8 = 8;
              do {
                if ((local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)local_1550 < 0) ||
                    ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)local_1550)) ||
                   ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fPhi).super_TPZFMatrix<double>.fElem[local_1550] =
                     local_1018.fElem[lVar5] * local_13d0.fElem[uVar4];
                lVar9 = 0;
                do {
                  if ((local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4)
                     || (local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                     (local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_1550 < 0)) ||
                     ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fCol <= (long)local_1550)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  *(double *)
                   ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                   lVar9 * 8 +
                   (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow * lVar7) =
                       *(double *)
                        ((long)local_a00.fElem +
                        lVar9 * 8 +
                        local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1520) *
                       local_13d0.fElem[uVar4] +
                       local_1018.fElem[lVar5] *
                       *(double *)
                        ((long)local_7a0.fElem +
                        lVar9 * 8 +
                        local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_1550 = local_1550 + 1;
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 8;
                lVar8 = lVar8 + 8;
              } while (uVar4 != uVar1);
            }
            TPZFMatrix<double>::~TPZFMatrix(&local_14a8,&PTR_PTR_018e21b0);
          }
          else if (1 < (int)uVar1) {
            local_1550 = (ulong)(int)uVar2;
            lVar7 = local_1550 * 8;
            uVar4 = 1;
            lVar8 = 8;
            do {
              if ((local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                 (local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                 (local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((long)local_1550 < 0) ||
                  ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                   .fRow <= (long)local_1550)) ||
                 ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (data->fPhi).super_TPZFMatrix<double>.fElem[local_1550] =
                   local_1018.fElem[lVar5] * local_13d0.fElem[uVar4];
              lVar9 = 0;
              do {
                if ((local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_13d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_1018.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_1550 < 0)) ||
                   ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol <= (long)local_1550)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                 lVar9 * 8 +
                 (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * lVar7) =
                     *(double *)
                      ((long)local_a00.fElem +
                      lVar9 * 8 +
                      local_a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_1520) *
                     local_13d0.fElem[uVar4] +
                     local_1018.fElem[lVar5] *
                     *(double *)
                      ((long)local_db8.fElem +
                      lVar9 * 8 + local_db8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8
                      );
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_1550 = local_1550 + 1;
              uVar4 = uVar4 + 1;
              lVar7 = lVar7 + 8;
              lVar8 = lVar8 + 8;
            } while (uVar4 != uVar1);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_1408);
          TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_db8,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_13d0,&PTR_PTR_0185f328);
        }
      }
      lVar5 = lVar5 + 1;
      local_1520 = local_1520 + 8;
    } while (lVar5 != 0x13);
    TPZFMatrix<double>::~TPZFMatrix(&local_a00,&PTR_PTR_018e48b0);
    TPZFMatrix<double>::~TPZFMatrix(&local_1018,&PTR_PTR_018e48b0);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}